

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BilateralMeshDenoising.cpp
# Opt level: O0

void __thiscall BilateralMeshDenoising::initParameters(BilateralMeshDenoising *this)

{
  ParameterSet *this_00;
  allocator local_31;
  string local_30 [32];
  BilateralMeshDenoising *local_10;
  BilateralMeshDenoising *this_local;
  
  local_10 = this;
  ParameterSet::removeAllParameter((this->super_MeshDenoisingBase).parameter_set_);
  this_00 = (this->super_MeshDenoisingBase).parameter_set_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"Iteration Num.",&local_31);
  ParameterSet::addParameter(this_00,(string *)local_30,5);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  return;
}

Assistant:

void BilateralMeshDenoising::initParameters()
{
    parameter_set_->removeAllParameter();
    parameter_set_->addParameter(string("Iteration Num."), 5);
}